

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrientationError.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::OrientationError::operator==(OrientationError *this,OrientationError *Value)

{
  KBOOL KVar1;
  KFIXED<short,_(unsigned_char)__b_> local_60;
  KFIXED<short,_(unsigned_char)__b_> local_50 [2];
  KFIXED<short,_(unsigned_char)__b_> local_30;
  OrientationError *local_20;
  OrientationError *Value_local;
  OrientationError *this_local;
  
  local_20 = Value;
  Value_local = this;
  KFIXED<short,_(unsigned_char)'\b'>::KFIXED(&local_30,&Value->m_AziErr);
  KVar1 = KFIXED<short,_(unsigned_char)'\b'>::operator!=(&this->m_AziErr,&local_30);
  KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(&local_30);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KFIXED<short,_(unsigned_char)'\b'>::KFIXED(local_50,&local_20->m_ElvErr);
    KVar1 = KFIXED<short,_(unsigned_char)'\b'>::operator!=(&this->m_ElvErr,local_50);
    KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(local_50);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KFIXED<short,_(unsigned_char)'\b'>::KFIXED(&local_60,&local_20->m_RotErr);
      KVar1 = KFIXED<short,_(unsigned_char)'\b'>::operator!=(&this->m_RotErr,&local_60);
      KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(&local_60);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL OrientationError::operator == ( const OrientationError & Value ) const
{
    if( m_AziErr != Value.m_AziErr )return false;
    if( m_ElvErr != Value.m_ElvErr )return false;
    if( m_RotErr != Value.m_RotErr )return false;
    return true;
}